

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<void> __thiscall
cinatra::coro_http_client::send_file_no_copy_with_chunked
          (coro_http_client *this,path *source,error_code *ec)

{
  element_type *peVar1;
  char *in_RCX;
  
  peVar1 = (element_type *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  if (peVar1 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         send_file_no_copy_with_chunked;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar1->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)send_file_no_copy_with_chunked;
    *(char **)((long)(peVar1->parser_).headers_._M_elems + 0x38) = in_RCX;
    ((string_view *)((long)(peVar1->parser_).headers_._M_elems + 0x30))->_M_len = (size_t)ec;
    *(path **)((long)(peVar1->parser_).headers_._M_elems + 0x28) = source;
    *(undefined8 *)&peVar1->parser_ = 0;
    (peVar1->parser_).msg_._M_len = 0;
    (peVar1->parser_).msg_._M_str = (char *)0x0;
    (peVar1->parser_).num_headers_ = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    *(undefined1 *)((long)(peVar1->parser_).headers_._M_elems + 0x8c) = 0;
  }
  return (LazyBase<void,_false>)(LazyBase<void,_false>)this;
}

Assistant:

async_simple::coro::Lazy<void> send_file_no_copy_with_chunked(
      const std::filesystem::path &source, std::error_code &ec) {
    fd_guard guard(source.c_str());
    if (guard.fd < 0) [[unlikely]] {
      ec = std::make_error_code(std::errc::bad_file_descriptor);
      co_return;
    }
    off_t now_position = 0,
          max_position = std::filesystem::file_size(source, ec);
    if (ec) {
      co_return;
    }
    size_t len =
        std::min<size_t>(max_single_part_size_, max_position - now_position);
    // send chunked
    std::array<char, 24> chunked_buffer;
    std::size_t sz;
    std::tie(ec, sz) = co_await async_write(
        asio::buffer(get_chuncked_buffers<true, false>(len, chunked_buffer)));
    if (ec) [[unlikely]] {
      co_return;
    }
    do {
      std::size_t actual_len = 0;
      std::tie(ec, actual_len) = co_await coro_io::async_sendfile(
          socket_->impl_, guard.fd, now_position, len);
      if (ec) [[unlikely]] {
        co_return;
      }
      if (actual_len != len) [[unlikely]] {
        // bad request, file is smaller than content-length
        ec = std::make_error_code(std::errc::invalid_argument);
        co_return;
      }
      if (now_position += actual_len; now_position < max_position) {
        len = std::min<size_t>(max_single_part_size_,
                               max_position - now_position);
        std::tie(ec, sz) = co_await async_write(asio::buffer(
            get_chuncked_buffers<false, false>(len, chunked_buffer)));
        if (ec) {
          co_return;
        }
      }
      else [[unlikely]] {
        std::tie(ec, sz) = co_await async_write(asio::buffer(
            get_chuncked_buffers<false, true>(len, chunked_buffer)));
        if (ec) {
          co_return;
        }
        break;
      }
    } while (true);
  }